

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::analysis::TensorViewNV::str_abi_cxx11_
          (string *__return_storage_ptr__,TensorViewNV *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  ostringstream oss;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"<",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  puVar1 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string TensorViewNV::str() const {
  std::ostringstream oss;
  oss << "<" << dim_id_ << ", " << has_dimensions_id_;
  for (auto p : perm_) {
    oss << ", " << p;
  }
  oss << ">";
  return oss.str();
}